

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

UBool icu_63::ICU_Utility::parseChar(UnicodeString *id,int32_t *pos,UChar ch)

{
  int32_t iVar1;
  int iVar2;
  char16_t cVar3;
  int32_t iVar4;
  int32_t start;
  UChar ch_local;
  int32_t *pos_local;
  UnicodeString *id_local;
  
  iVar1 = *pos;
  skipWhitespace(id,pos,'\x01');
  iVar2 = *pos;
  iVar4 = UnicodeString::length(id);
  if ((iVar2 != iVar4) && (cVar3 = UnicodeString::charAt(id,*pos), cVar3 == ch)) {
    *pos = *pos + 1;
    return '\x01';
  }
  *pos = iVar1;
  return '\0';
}

Assistant:

UBool ICU_Utility::parseChar(const UnicodeString& id, int32_t& pos, UChar ch) {
    int32_t start = pos;
    skipWhitespace(id, pos, TRUE);
    if (pos == id.length() ||
        id.charAt(pos) != ch) {
        pos = start;
        return FALSE;
    }
    ++pos;
    return TRUE;
}